

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

Gia_Man_t * Bmc_CexPerformUnrolling(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  Gia_Man_t *p_00;
  size_t sVar13;
  char *pcVar14;
  Gia_Obj_t *pGVar15;
  Gia_Man_t *pGVar16;
  long lVar17;
  Vec_Int_t *pVVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                  ,0x8f,"Gia_Man_t *Bmc_CexPerformUnrolling(Gia_Man_t *, Abc_Cex_t *)");
  }
  p_00 = Gia_ManStart((pCex->iFrame + 1) * p->nObjs);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar13 = strlen(pcVar4);
    pcVar14 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar14,pcVar4);
  }
  p_00->pName = pcVar14;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar13 = strlen(pcVar4);
    pcVar14 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar14,pcVar4);
  }
  p_00->pSpec = pcVar14;
  pGVar5 = p->pObjs;
  pGVar5->Value = 0;
  lVar17 = (long)p->nRegs;
  if (0 < lVar17) {
    pVVar18 = p->vCos;
    iVar10 = pVVar18->nSize;
    uVar20 = (ulong)(uint)(iVar10 - p->nRegs);
    do {
      if (((int)uVar20 < 0) || (iVar10 <= (int)uVar20)) goto LAB_00528d5a;
      iVar12 = pVVar18->pArray[uVar20];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_00528d1c;
      pGVar5[iVar12].Value = 0;
      uVar20 = uVar20 + 1;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  Gia_ManHashAlloc(p_00);
  if (-1 < pCex->iFrame) {
    iVar10 = 0;
    do {
      uVar11 = p->nRegs;
      pVVar18 = p->vCis;
      iVar12 = pVVar18->nSize;
      iVar19 = iVar12 - uVar11;
      if (iVar19 != 0 && (int)uVar11 <= iVar12) {
        lVar17 = 0;
        do {
          if (iVar12 <= lVar17) goto LAB_00528d5a;
          iVar1 = pVVar18->pArray[lVar17];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00528d1c;
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          pGVar15 = Gia_ManAppendObj(p_00);
          uVar20 = *(ulong *)pGVar15;
          *(ulong *)pGVar15 = uVar20 | 0x9fffffff;
          *(ulong *)pGVar15 =
               uVar20 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar6 = p_00->pObjs;
          if ((pGVar15 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar15)) {
LAB_00528d3b:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2) * -0x55555555);
          pGVar6 = p_00->pObjs;
          if ((pGVar15 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar15)) goto LAB_00528d3b;
          pGVar5[iVar1].Value = (int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2) * 0x55555556;
          lVar17 = lVar17 + 1;
          uVar11 = p->nRegs;
          pVVar18 = p->vCis;
          iVar12 = pVVar18->nSize;
          iVar19 = iVar12 - uVar11;
        } while (lVar17 < iVar19);
      }
      if ((int)uVar11 < 1) {
        uVar11 = p->nObjs;
        if (0 < (int)uVar11) goto LAB_00528b6e;
      }
      else {
        pVVar7 = p->vCos;
        iVar1 = pVVar7->nSize;
        uVar21 = iVar1 - uVar11;
        lVar17 = (long)iVar19;
        uVar20 = (ulong)uVar11;
        do {
          if (((int)uVar21 < 0) || (iVar1 <= (int)uVar21)) goto LAB_00528d5a;
          iVar2 = pVVar7->pArray[uVar21];
          if (((long)iVar2 < 0) || (uVar11 = p->nObjs, (int)uVar11 <= iVar2)) goto LAB_00528d1c;
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          if ((iVar19 < 0) || (iVar12 <= lVar17)) goto LAB_00528d5a;
          uVar3 = pVVar18->pArray[lVar17];
          if (((long)(int)uVar3 < 0) || (uVar11 <= uVar3)) goto LAB_00528d1c;
          pGVar5[(int)uVar3].Value = pGVar5[iVar2].Value;
          lVar17 = lVar17 + 1;
          uVar21 = uVar21 + 1;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
LAB_00528b6e:
        lVar17 = 8;
        lVar22 = 0;
        do {
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          uVar20 = *(ulong *)((long)pGVar5 + lVar17 + -8);
          if ((uVar20 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar20) {
            uVar11 = *(uint *)((long)pGVar5 +
                              lVar17 + (ulong)(uint)((int)(uVar20 & 0x1fffffff) << 2) * -3);
            if (((int)uVar11 < 0) ||
               (uVar21 = *(uint *)((long)pGVar5 +
                                  lVar17 + (ulong)((uint)(uVar20 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar21 < 0)) goto LAB_00528d79;
            iVar12 = Gia_ManHashAnd(p_00,uVar11 ^ (uint)(uVar20 >> 0x1d) & 1,
                                    uVar21 ^ (uint)(uVar20 >> 0x3d) & 1);
            *(int *)(&pGVar5->field_0x0 + lVar17) = iVar12;
            uVar11 = p->nObjs;
          }
          lVar22 = lVar22 + 1;
          lVar17 = lVar17 + 0xc;
        } while (lVar22 < (int)uVar11);
      }
      lVar17 = (long)p->vCos->nSize;
      if (0 < lVar17) {
        piVar8 = p->vCos->pArray;
        lVar22 = 0;
        do {
          iVar12 = piVar8[lVar22];
          if (((long)iVar12 < 0) || ((int)uVar11 <= iVar12)) goto LAB_00528d1c;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar5 = p->pObjs + iVar12;
          if ((int)pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value < 0) {
LAB_00528d79:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf5,"int Abc_LitNotCond(int, int)");
          }
          pGVar5->Value =
               (uint)*(undefined8 *)pGVar5 >> 0x1d & 1 ^
               pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value;
          lVar22 = lVar22 + 1;
        } while (lVar17 != lVar22);
      }
      bVar9 = iVar10 < pCex->iFrame;
      iVar10 = iVar10 + 1;
    } while (bVar9);
  }
  Gia_ManHashStop(p_00);
  uVar11 = pCex->iPo;
  iVar10 = p->vCos->nSize;
  if (iVar10 - p->nRegs <= (int)uVar11) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar11) && ((int)uVar11 < iVar10)) {
    iVar10 = p->vCos->pArray[uVar11];
    if ((-1 < (long)iVar10) && (iVar10 < p->nObjs)) {
      Gia_ManAppendCo(p_00,p->pObjs[iVar10].Value);
      pGVar16 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar16;
    }
LAB_00528d1c:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_00528d5a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Gia_Man_t * Bmc_CexPerformUnrolling( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k;
    assert( Gia_ManRegNum(p) > 0 );
    pNew = Gia_ManStart( (pCex->iFrame + 1) * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachRi( p, pObj, k )
        pObj->Value = 0;
    Gia_ManHashAlloc( pNew );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->Value = pObjRi->Value;
        Gia_ManForEachAnd( p, pObj, k )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, k )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
    }
    Gia_ManHashStop( pNew );
    pObj = Gia_ManPo(p, pCex->iPo);
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}